

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseResidency.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sparse::anon_unknown_4::ImageSparseResidencyInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSparseResidencyInstance *this)

{
  UVec3 *imageSize;
  int *piVar1;
  string *psVar2;
  TextureFormat *format;
  TextureFormat TVar3;
  VkImageAspectFlags VVar4;
  uint uVar5;
  Handle<(vk::HandleType)7> vk;
  VkDeviceSize VVar6;
  VkDeviceSize VVar7;
  VkDeviceSize VVar8;
  Handle<(vk::HandleType)7> HVar9;
  VkDevice pVVar10;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  deUint32 srcQueueFamilyIndex;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  undefined8 image;
  undefined8 commandBuffer;
  void *pvVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  deUint32 dVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  VkResult result;
  VkImageViewType imageViewType;
  VkFormat format_00;
  uint uVar19;
  int iVar20;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar21;
  Queue *pQVar22;
  Handle<(vk::HandleType)7> HVar23;
  Handle<(vk::HandleType)7> *pHVar24;
  DescriptorSetLayoutBuilder *this_01;
  const_iterator cVar25;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  NotSupportedError *pNVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  deUint32 dVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  ulong uVar48;
  int iVar49;
  uint uVar50;
  uint uVar51;
  bool bVar52;
  VkExtent3D VVar53;
  VkDeviceSize in_stack_fffffffffffff798;
  uint local_850;
  int local_83c;
  long *local_828;
  long local_820;
  long local_818 [2];
  TestStatus *local_808;
  string *local_800;
  ulong local_7f8;
  ulong local_7f0;
  VkBufferCreateInfo outputBufferCreateInfo;
  pointer pVStack_7b0;
  pointer local_7a8;
  ulong local_778;
  uint local_74c;
  VkSparseImageMemoryBindInfo imageResidencyBindInfo;
  uint local_708;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> imageMipTailMemoryBinds;
  UVec4 referenceValue;
  VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;
  int local_670;
  int local_66c;
  vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
  imageResidencyMemoryBinds;
  UVec3 gridSize;
  ConstPixelBufferAccess pixelBuffer;
  VkOffset3D offset;
  undefined4 uStack_5cc;
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  sparseMemoryRequirements;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_570;
  ulong local_550;
  int local_544;
  uint local_540;
  uint local_53c;
  VkExtent3D extent;
  undefined4 uStack_52c;
  VkImageSubresource subresource;
  undefined4 uStack_50c;
  undefined1 local_4c0 [28];
  VkExtent3D local_4a4;
  uint local_498;
  deUint32 local_494;
  undefined8 local_490;
  undefined8 local_488;
  deUint32 local_480;
  deUint32 *local_478;
  VkImageLayout local_470;
  TextureFormat local_468;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_460;
  VkSemaphore local_448;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_440;
  UVec4 outputValue;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkPipelineStageFlags stageBits [1];
  VkDescriptorImageInfo sparseImageInfo;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_388;
  VkPhysicalDeviceProperties physicalDeviceProperties;
  string *psVar41;
  
  local_808 = __return_storage_ptr__;
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceProperties(&physicalDeviceProperties,vk_00,physicalDevice);
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imageSize = &this->m_imageSize;
  bVar14 = isImageSizeSupported(vk_00,physicalDevice,this->m_imageType,imageSize);
  if (!bVar14) {
    pNVar26 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar26,"Image size not supported for device",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0xd0);
LAB_00754586:
    __cxa_throw(pNVar26,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar14 = checkSparseSupportForImageType(vk_00,physicalDevice,this->m_imageType);
  if (!bVar14) {
    pNVar26 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar26,"Sparse residency for image type is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0xd4);
    goto LAB_00754586;
  }
  local_4c0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_4c0._8_8_ = (void *)0x0;
  local_4c0._16_4_ = 3;
  local_4c0._20_4_ = mapImageType(this->m_imageType);
  format = &this->m_format;
  local_4c0._24_4_ = ::vk::mapTextureFormat(format);
  getLayerSize((sparse *)&outputBufferCreateInfo,this->m_imageType,imageSize);
  local_4a4.width = outputBufferCreateInfo.sType;
  local_4a4.height = outputBufferCreateInfo._4_4_;
  local_4a4.depth = (uint)outputBufferCreateInfo.pNext;
  local_498 = 1;
  local_494 = getNumLayers(this->m_imageType,imageSize);
  local_490._0_4_ = VK_SAMPLE_COUNT_1_BIT;
  local_490._4_4_ = VK_IMAGE_TILING_OPTIMAL;
  local_470 = VK_IMAGE_LAYOUT_UNDEFINED;
  local_488._0_4_ = 9;
  local_488._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  local_480 = 0;
  local_478 = (deUint32 *)0x0;
  if (this->m_imageType - IMAGE_TYPE_CUBE < 2) {
    local_4c0._16_4_ = local_4c0._16_4_ | 0x10;
  }
  bVar14 = checkSparseSupportForImageFormat(vk_00,physicalDevice,(VkImageCreateInfo *)local_4c0);
  if (!bVar14) {
    pNVar26 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar26,"The image format does not support sparse operations",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0xee);
    goto LAB_00754586;
  }
  outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  outputBufferCreateInfo._4_4_ = 0;
  outputBufferCreateInfo.pNext = (void *)0x0;
  outputBufferCreateInfo.flags = 0;
  outputBufferCreateInfo._20_4_ = 0;
  pixelBuffer.m_format.order = RGBA;
  pixelBuffer.m_format.type = SNORM_INT16;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              *)&outputBufferCreateInfo,(QueueRequirements *)&pixelBuffer);
  pixelBuffer.m_format.order = I;
  pixelBuffer.m_format.type = SNORM_INT16;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              *)&outputBufferCreateInfo,(QueueRequirements *)&pixelBuffer);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,
             (QueueRequirementsVec *)&outputBufferCreateInfo);
  if (outputBufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)outputBufferCreateInfo._0_8_,
                    outputBufferCreateInfo._16_8_ - outputBufferCreateInfo._0_8_);
  }
  vk.m_internal =
       (deUint64)
       (this->super_SparseResourcesBaseInstance).m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pQVar21 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  pQVar22 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&outputBufferCreateInfo,
                    (DeviceInterface *)vk.m_internal,
                    (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                    super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkImageCreateInfo *)local_4c0,
                    (VkAllocationCallbacks *)0x0);
  image = outputBufferCreateInfo._0_8_;
  DStack_570.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
  DStack_570.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
  DStack_570.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&outputBufferCreateInfo,
             (DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
  DStack_440.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
  DStack_440.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
  local_448.m_internal = outputBufferCreateInfo._0_8_;
  DStack_440.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&pixelBuffer,(DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkImage)image);
  if (physicalDeviceProperties.limits.sparseAddressSpaceSize < (ulong)pixelBuffer.m_format) {
    pNVar26 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar26,"Required memory size for sparse resource exceeds device limits",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0x108);
    __cxa_throw(pNVar26,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ::vk::getImageSparseMemoryRequirements
            (&sparseMemoryRequirements,(DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkImage)image);
  dVar15 = getSparseAspectRequirementsIndex(&sparseMemoryRequirements,1);
  if (dVar15 == 0xffffffff) {
    pNVar26 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar26,
               "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0x114);
    __cxa_throw(pNVar26,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  VVar4 = sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start[dVar15].formatProperties.aspectMask;
  uVar51 = sparseMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_start[dVar15].formatProperties.imageGranularity.width
  ;
  uVar36 = sparseMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_start[dVar15].formatProperties.imageGranularity.
           height;
  uVar5 = sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start[dVar15].formatProperties.imageGranularity.depth;
  uVar19 = sparseMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_start[dVar15].formatProperties.flags;
  uVar43 = sparseMemoryRequirements.
           super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
           ._M_impl.super__Vector_impl_data._M_start[dVar15].imageMipTailFirstLod;
  VVar6 = sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start[dVar15].imageMipTailSize;
  VVar7 = sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start[dVar15].imageMipTailOffset;
  VVar8 = sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start[dVar15].imageMipTailStride;
  imageResidencyMemoryBinds.
  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imageResidencyMemoryBinds.
  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imageResidencyMemoryBinds.
  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imageMipTailMemoryBinds.
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imageMipTailMemoryBinds.
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  imageMipTailMemoryBinds.
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar15 = findMatchingMemoryType
                     (vk_00,physicalDevice,(VkMemoryRequirements *)&pixelBuffer,
                      (MemoryRequirement *)&::vk::MemoryRequirement::Any);
  if (dVar15 == 0xffffffff) {
    outputBufferCreateInfo._0_8_ = &outputBufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&outputBufferCreateInfo,"No matching memory type found","");
    local_808->m_code = QP_TEST_RESULT_FAIL;
    (local_808->m_description)._M_dataplus._M_p = (pointer)&(local_808->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_808->m_description,outputBufferCreateInfo._0_8_,
               (long)outputBufferCreateInfo.pNext + outputBufferCreateInfo._0_8_);
    if ((VkBufferCreateFlags *)outputBufferCreateInfo._0_8_ != &outputBufferCreateInfo.flags) {
      operator_delete((void *)outputBufferCreateInfo._0_8_,outputBufferCreateInfo._16_8_ + 1);
    }
  }
  else {
    if (local_494 != 0) {
      local_778 = 0;
      do {
        if (uVar43 != 0) {
          dVar38 = 0;
          do {
            subresource.mipLevel = dVar38;
            subresource.aspectMask = VVar4;
            stack0xfffffffffffffaf0 = (void *)CONCAT44(uStack_50c,(int)local_778);
            local_550 = CONCAT44(local_550._4_4_,dVar38);
            VVar53 = mipLevelExtents(&local_4a4,dVar38);
            uVar31 = VVar53._0_8_ & 0xffffffff;
            uVar39 = VVar53._0_8_ >> 0x20;
            uVar18 = (uint)(uVar39 % (ulong)uVar36);
            uVar27 = uVar18;
            if (uVar18 == 0) {
              uVar27 = uVar36;
            }
            uVar37 = (uint)(uVar31 % (ulong)uVar51);
            uVar42 = uVar37;
            if (uVar37 == 0) {
              uVar42 = uVar51;
            }
            uVar33 = VVar53.depth % uVar5;
            uVar34 = uVar33;
            if (uVar33 == 0) {
              uVar34 = uVar5;
            }
            uVar33 = (uint)(uVar33 != 0) + VVar53.depth / uVar5;
            if (uVar33 != 0) {
              uVar37 = (int)(uVar31 / uVar51) + (uint)(uVar37 != 0);
              uVar44 = (int)(uVar39 / uVar36) + (uint)(uVar18 != 0);
              local_800 = (string *)CONCAT44(local_800._4_4_,uVar37 - 1);
              uVar18 = 0;
              do {
                if (uVar44 != 0) {
                  local_7f8 = CONCAT44(local_7f8._4_4_,uVar18 * uVar5);
                  uVar16 = uVar5;
                  if (uVar18 == uVar33 - 1) {
                    uVar16 = uVar34;
                  }
                  uVar17 = 0;
                  do {
                    if (uVar37 != 0) {
                      local_7f0 = CONCAT44(local_7f0._4_4_,uVar17 * uVar36);
                      uVar35 = uVar36;
                      if (uVar17 == uVar44 - 1) {
                        uVar35 = uVar27;
                      }
                      iVar45 = 0;
                      uVar50 = 0;
                      do {
                        if ((uVar50 + ((uVar33 * (int)local_778 + uVar18) * uVar44 + uVar17) *
                                      uVar37 & 1) == 0) {
                          offset.y = (deInt32)local_7f0;
                          offset.x = iVar45;
                          stack0xfffffffffffffa30 = (long *)CONCAT44(uStack_5cc,(int)local_7f8);
                          extent.width = uVar51;
                          if ((uint)local_800 == uVar50) {
                            extent.width = uVar42;
                          }
                          extent.height = uVar35;
                          stack0xfffffffffffffad0 = (void *)CONCAT44(uStack_52c,uVar16);
                          makeSparseImageMemoryBind
                                    ((VkSparseImageMemoryBind *)&outputBufferCreateInfo,
                                     (DeviceInterface *)vk.m_internal,
                                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                                     super_RefBase<vk::VkDevice_s_*>.m_data.object,
                                     pixelBuffer.m_size.m_data._0_8_,dVar15,&subresource,&offset,
                                     &extent);
                          HVar23.m_internal =
                               (deUint64)
                               ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                                         ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._40_8_);
                          HVar9.m_internal =
                               (deUint64)
                               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                               super_RefBase<vk::VkDevice_s_*>.m_data.object;
                          pHVar24 = (Handle<(vk::HandleType)7> *)operator_new(0x20);
                          pHVar24[2].m_internal = HVar9.m_internal;
                          pHVar24[3].m_internal = 0;
                          pHVar24->m_internal = HVar23.m_internal;
                          pHVar24[1].m_internal = vk.m_internal;
                          imageMipTailBindInfo.bindCount = 0;
                          imageMipTailBindInfo._12_4_ = 0;
                          imageMipTailBindInfo.image.m_internal = (deUint64)pHVar24;
                          imageMipTailBindInfo._8_8_ = operator_new(0x20);
                          *(undefined4 *)(imageMipTailBindInfo._8_8_ + 8) = 0;
                          *(undefined4 *)(imageMipTailBindInfo._8_8_ + 0xc) = 0;
                          *(undefined ***)imageMipTailBindInfo._8_8_ = &PTR__SharedPtrState_00d1dd90
                          ;
                          *(Handle<(vk::HandleType)7> **)(imageMipTailBindInfo._8_8_ + 0x10) =
                               pHVar24;
                          *(undefined4 *)(imageMipTailBindInfo._8_8_ + 8) = 1;
                          *(undefined4 *)(imageMipTailBindInfo._8_8_ + 0xc) = 1;
                          std::
                          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                          ::
                          emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                                      *)&deviceMemUniquePtrVec,
                                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>
                                      *)&imageMipTailBindInfo);
                          if (imageMipTailBindInfo._8_8_ != 0) {
                            LOCK();
                            piVar1 = (int *)(imageMipTailBindInfo._8_8_ + 8);
                            *piVar1 = *piVar1 + -1;
                            UNLOCK();
                            if (*piVar1 == 0) {
                              imageMipTailBindInfo.image.m_internal = 0;
                              (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 0x10))();
                            }
                            LOCK();
                            piVar1 = (int *)(imageMipTailBindInfo._8_8_ + 0xc);
                            *piVar1 = *piVar1 + -1;
                            UNLOCK();
                            if (*piVar1 == 0) {
                              if (imageMipTailBindInfo._8_8_ != 0) {
                                (**(code **)(*(long *)imageMipTailBindInfo._8_8_ + 8))();
                              }
                              imageMipTailBindInfo.bindCount = 0;
                              imageMipTailBindInfo._12_4_ = 0;
                            }
                          }
                          if (imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish ==
                              imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::
                            vector<vk::VkSparseImageMemoryBind,std::allocator<vk::VkSparseImageMemoryBind>>
                            ::_M_realloc_insert<vk::VkSparseImageMemoryBind_const&>
                                      ((vector<vk::VkSparseImageMemoryBind,std::allocator<vk::VkSparseImageMemoryBind>>
                                        *)&imageResidencyMemoryBinds,
                                       (iterator)
                                       imageResidencyMemoryBinds.
                                       super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                                       (VkSparseImageMemoryBind *)&outputBufferCreateInfo);
                          }
                          else {
                            (imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->memoryOffset =
                                 (VkDeviceSize)outputBufferCreateInfo.pQueueFamilyIndices;
                            *(pointer *)
                             &(imageResidencyMemoryBinds.
                               super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->flags = pVStack_7b0;
                            *(undefined8 *)
                             &((imageResidencyMemoryBinds.
                                super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->extent).depth =
                                 outputBufferCreateInfo._32_8_;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->memory).m_internal =
                                 outputBufferCreateInfo._40_8_;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset).y =
                                 outputBufferCreateInfo.flags;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset).z =
                                 outputBufferCreateInfo._20_4_;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->extent).width =
                                 (undefined4)outputBufferCreateInfo.size;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->extent).height =
                                 outputBufferCreateInfo.size._4_4_;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->subresource).aspectMask =
                                 outputBufferCreateInfo.sType;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->subresource).mipLevel =
                                 outputBufferCreateInfo._4_4_;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->subresource).arrayLayer =
                                 (uint)outputBufferCreateInfo.pNext;
                            ((imageResidencyMemoryBinds.
                              super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset).x =
                                 outputBufferCreateInfo.pNext._4_4_;
                            imageResidencyMemoryBinds.
                            super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_finish =
                                 imageResidencyMemoryBinds.
                                 super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                        }
                        uVar50 = uVar50 + 1;
                        iVar45 = iVar45 + uVar51;
                      } while (uVar50 < uVar37);
                    }
                    uVar17 = uVar17 + 1;
                  } while (uVar17 < uVar44);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 < uVar33);
            }
            dVar38 = (int)local_550 + 1;
          } while (dVar38 != uVar43);
        }
        if (((uVar19 & 1) == 0) && (uVar43 < local_498)) {
          makeSparseMemoryBind
                    ((VkSparseMemoryBind *)&outputBufferCreateInfo,(DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,VVar6,dVar15,
                     VVar8 * local_778 + VVar7);
          HVar23.m_internal =
               (deUint64)
               ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                         ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._16_8_);
          HVar9.m_internal =
               (deUint64)
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object;
          pHVar24 = (Handle<(vk::HandleType)7> *)operator_new(0x20);
          pHVar24[2].m_internal = HVar9.m_internal;
          pHVar24[3].m_internal = 0;
          pHVar24->m_internal = HVar23.m_internal;
          pHVar24[1].m_internal = vk.m_internal;
          imageResidencyBindInfo.bindCount = 0;
          imageResidencyBindInfo._12_4_ = 0;
          imageResidencyBindInfo.image.m_internal = (deUint64)pHVar24;
          imageResidencyBindInfo._8_8_ = operator_new(0x20);
          *(undefined4 *)(imageResidencyBindInfo._8_8_ + 8) = 0;
          *(undefined4 *)(imageResidencyBindInfo._8_8_ + 0xc) = 0;
          *(undefined ***)imageResidencyBindInfo._8_8_ = &PTR__SharedPtrState_00d1dd90;
          *(Handle<(vk::HandleType)7> **)(imageResidencyBindInfo._8_8_ + 0x10) = pHVar24;
          *(undefined4 *)(imageResidencyBindInfo._8_8_ + 8) = 1;
          *(undefined4 *)(imageResidencyBindInfo._8_8_ + 0xc) = 1;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                      *)&deviceMemUniquePtrVec,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                     &imageResidencyBindInfo);
          if (imageResidencyBindInfo._8_8_ != 0) {
            LOCK();
            piVar1 = (int *)(imageResidencyBindInfo._8_8_ + 8);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              imageResidencyBindInfo.image.m_internal = 0;
              (**(code **)(*(long *)imageResidencyBindInfo._8_8_ + 0x10))();
            }
            LOCK();
            piVar1 = (int *)(imageResidencyBindInfo._8_8_ + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (imageResidencyBindInfo._8_8_ != 0) {
                (**(code **)(*(long *)imageResidencyBindInfo._8_8_ + 8))();
              }
              imageResidencyBindInfo.bindCount = 0;
              imageResidencyBindInfo._12_4_ = 0;
            }
          }
          if (imageMipTailMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              imageMipTailMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
            _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                      ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>> *)
                       &imageMipTailMemoryBinds,
                       (iterator)
                       imageMipTailMemoryBinds.
                       super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (VkSparseMemoryBind *)&outputBufferCreateInfo);
          }
          else {
            (imageMipTailMemoryBinds.
             super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
             _M_impl.super__Vector_impl_data._M_finish)->flags = outputBufferCreateInfo.usage;
            *(VkSharingMode *)
             &(imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish)->field_0x24 =
                 outputBufferCreateInfo.sharingMode;
            ((imageMipTailMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_finish)->memory).m_internal =
                 outputBufferCreateInfo._16_8_;
            (imageMipTailMemoryBinds.
             super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
             _M_impl.super__Vector_impl_data._M_finish)->memoryOffset = outputBufferCreateInfo.size;
            *(VkStructureType *)
             &(imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_finish)->resourceOffset =
                 outputBufferCreateInfo.sType;
            *(undefined4 *)
             ((long)&(imageMipTailMemoryBinds.
                      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->resourceOffset + 4) =
                 outputBufferCreateInfo._4_4_;
            *(uint *)&(imageMipTailMemoryBinds.
                       super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->size =
                 (uint)outputBufferCreateInfo.pNext;
            *(deInt32 *)
             ((long)&(imageMipTailMemoryBinds.
                      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->size + 4) =
                 outputBufferCreateInfo.pNext._4_4_;
            imageMipTailMemoryBinds.
            super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 imageMipTailMemoryBinds.
                 super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        local_778 = local_778 + 1;
      } while (local_778 < local_494);
    }
    if (((uVar19 & 1) != 0) && (uVar43 < local_498)) {
      makeSparseMemoryBind
                ((VkSparseMemoryBind *)&outputBufferCreateInfo,(DeviceInterface *)vk.m_internal,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,VVar6,dVar15,VVar7);
      local_388.m_data.object.m_internal =
           (deUint64)
           ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                     ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._16_8_);
      local_388.m_data.deleter.m_device =
           (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
           .m_data.object;
      local_388.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)vk.m_internal;
      makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>
                ((sparse *)&imageResidencyBindInfo,
                 (Move<vk::Handle<(vk::HandleType)7>_> *)&local_388);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                  *)&deviceMemUniquePtrVec,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                 &imageResidencyBindInfo);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                 &imageResidencyBindInfo);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_388);
      if (imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
        _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                  ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>> *)
                   &imageMipTailMemoryBinds,
                   (iterator)
                   imageMipTailMemoryBinds.
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (VkSparseMemoryBind *)&outputBufferCreateInfo);
      }
      else {
        (imageMipTailMemoryBinds.
         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl
         .super__Vector_impl_data._M_finish)->flags = outputBufferCreateInfo.usage;
        *(VkSharingMode *)
         &(imageMipTailMemoryBinds.
           super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x24 =
             outputBufferCreateInfo.sharingMode;
        ((imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_finish)->memory).m_internal =
             outputBufferCreateInfo._16_8_;
        (imageMipTailMemoryBinds.
         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl
         .super__Vector_impl_data._M_finish)->memoryOffset = outputBufferCreateInfo.size;
        (imageMipTailMemoryBinds.
         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl
         .super__Vector_impl_data._M_finish)->resourceOffset = outputBufferCreateInfo._0_8_;
        (imageMipTailMemoryBinds.
         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl
         .super__Vector_impl_data._M_finish)->size = (VkDeviceSize)outputBufferCreateInfo.pNext;
        imageMipTailMemoryBinds.
        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
        super__Vector_impl_data._M_finish =
             imageMipTailMemoryBinds.
             super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    outputBufferCreateInfo.pNext = (void *)0x0;
    outputBufferCreateInfo.usage = 0;
    outputBufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    outputBufferCreateInfo.queueFamilyIndexCount = 0;
    outputBufferCreateInfo._44_4_ = 0;
    outputBufferCreateInfo.flags = 0;
    outputBufferCreateInfo._20_4_ = 0;
    outputBufferCreateInfo.size = 0;
    outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
    outputBufferCreateInfo._4_4_ = 0;
    uVar31 = (long)imageResidencyMemoryBinds.
                   super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)imageResidencyMemoryBinds.
                   super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (uVar31 != 0) {
      imageResidencyBindInfo.image.m_internal = image;
      imageResidencyBindInfo.bindCount = (deUint32)(uVar31 >> 6);
      imageResidencyBindInfo.pBinds =
           imageResidencyMemoryBinds.
           super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    local_7a8 = (pointer)(ulong)(uVar31 != 0);
    uVar31 = (long)imageMipTailMemoryBinds.
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)imageMipTailMemoryBinds.
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (uVar31 != 0) {
      imageMipTailBindInfo.image.m_internal = image;
      imageMipTailBindInfo.bindCount = (int)(uVar31 >> 3) * -0x33333333;
      imageMipTailBindInfo.pBinds =
           imageMipTailMemoryBinds.
           super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    outputBufferCreateInfo.pQueueFamilyIndices = (deUint32 *)(ulong)(uVar31 != 0);
    result = (*(*(_func_int ***)vk.m_internal)[0x11])
                       (vk.m_internal,pQVar21->queueHandle,1,&outputBufferCreateInfo);
    ::vk::checkResult(result,
                      "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                      ,0x18b);
  }
  if (imageMipTailMemoryBinds.
      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(imageMipTailMemoryBinds.
                    super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)imageMipTailMemoryBinds.
                          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)imageMipTailMemoryBinds.
                          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (imageResidencyMemoryBinds.
      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(imageResidencyMemoryBinds.
                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)imageResidencyMemoryBinds.
                          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)imageResidencyMemoryBinds.
                          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (sparseMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sparseMemoryRequirements.
                    super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)sparseMemoryRequirements.
                          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sparseMemoryRequirements.
                          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (dVar15 == 0xffffffff) goto LAB_00754496;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&outputBufferCreateInfo,
                  (DeviceInterface *)vk.m_internal,
                  (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                  super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar22->queueFamilyIndex);
  sparseMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)outputBufferCreateInfo._16_8_;
  sparseMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)outputBufferCreateInfo._0_8_;
  sparseMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)outputBufferCreateInfo.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&outputBufferCreateInfo,
             (DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkCommandPool)outputBufferCreateInfo._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar6 = outputBufferCreateInfo.size;
  uVar12 = outputBufferCreateInfo._16_8_;
  pvVar11 = outputBufferCreateInfo.pNext;
  commandBuffer = outputBufferCreateInfo._0_8_;
  beginCommandBuffer((DeviceInterface *)vk.m_internal,(VkCommandBuffer)outputBufferCreateInfo._0_8_)
  ;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&outputBufferCreateInfo);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&outputBufferCreateInfo,
                       VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&pixelBuffer,this_01,
             (DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
  imageResidencyMemoryBinds.
  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pixelBuffer._16_8_;
  imageResidencyMemoryBinds.
  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pixelBuffer.m_format;
  imageResidencyMemoryBinds.
  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)pixelBuffer.m_size.m_data._0_8_;
  pixelBuffer.m_format.order = R;
  pixelBuffer.m_format.type = SNORM_INT8;
  pixelBuffer.m_size.m_data[0] = 0;
  pixelBuffer.m_size.m_data[1] = 0;
  pixelBuffer.m_size.m_data[2] = 0;
  pixelBuffer.m_pitch.m_data[0] = 0;
  pixelBuffer.m_pitch.m_data[1] = 0;
  pixelBuffer.m_pitch.m_data[2] = 0;
  if (outputBufferCreateInfo.pQueueFamilyIndices != (deUint32 *)0x0) {
    operator_delete(outputBufferCreateInfo.pQueueFamilyIndices,
                    (long)local_7a8 - (long)outputBufferCreateInfo.pQueueFamilyIndices);
  }
  if (outputBufferCreateInfo.size != 0) {
    operator_delete((void *)outputBufferCreateInfo.size,
                    outputBufferCreateInfo._40_8_ - outputBufferCreateInfo.size);
  }
  if (outputBufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)outputBufferCreateInfo._0_8_,
                    outputBufferCreateInfo._16_8_ - outputBufferCreateInfo._0_8_);
  }
  pVVar10 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
            super_RefBase<vk::VkDevice_s_*>.m_data.object;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context)->
               m_progCollection;
  TVar3 = (TextureFormat)(pixelBuffer.m_size.m_data + 2);
  pixelBuffer.m_format = TVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelBuffer,"comp","");
  cVar25 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&pixelBuffer);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&outputBufferCreateInfo,
             (DeviceInterface *)vk.m_internal,pVVar10,*(ProgramBinary **)(cVar25._M_node + 2),0);
  imageMipTailMemoryBinds.
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)outputBufferCreateInfo._16_8_;
  imageMipTailMemoryBinds.
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)outputBufferCreateInfo._0_8_;
  imageMipTailMemoryBinds.
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)outputBufferCreateInfo.pNext;
  outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  outputBufferCreateInfo._4_4_ = 0;
  outputBufferCreateInfo.pNext = (void *)0x0;
  outputBufferCreateInfo.flags = 0;
  outputBufferCreateInfo._20_4_ = 0;
  outputBufferCreateInfo.size = 0;
  if (pixelBuffer.m_format != TVar3) {
    operator_delete((void *)pixelBuffer.m_format,pixelBuffer._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&outputBufferCreateInfo,
                     (DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (VkDescriptorSetLayout)
                     imageResidencyMemoryBinds.
                     super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  imageResidencyBindInfo.pBinds = (VkSparseImageMemoryBind *)outputBufferCreateInfo._16_8_;
  imageResidencyBindInfo.image.m_internal = outputBufferCreateInfo._0_8_;
  imageResidencyBindInfo._8_8_ = outputBufferCreateInfo.pNext;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&outputBufferCreateInfo,
                      (DeviceInterface *)vk.m_internal,
                      (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                      super_RefBase<vk::VkDevice_s_*>.m_data.object,
                      (VkPipelineLayout)outputBufferCreateInfo._0_8_,
                      (VkShaderModule)
                      imageMipTailMemoryBinds.
                      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                      ._M_impl.super__Vector_impl_data._M_start,(VkSpecializationInfo *)0x0);
  imageMipTailBindInfo.pBinds = (VkSparseMemoryBind *)outputBufferCreateInfo._16_8_;
  imageMipTailBindInfo.image.m_internal = outputBufferCreateInfo._0_8_;
  imageMipTailBindInfo._8_8_ = outputBufferCreateInfo.pNext;
  (*(*(_func_int ***)vk.m_internal)[0x4c])
            (vk.m_internal,commandBuffer,1,outputBufferCreateInfo._0_8_);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&pixelBuffer);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&pixelBuffer,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&outputBufferCreateInfo,this_02,
             (DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,1,1);
  subresource.aspectMask = outputBufferCreateInfo.sType;
  subresource.mipLevel = outputBufferCreateInfo._4_4_;
  stack0xfffffffffffffaf0 = outputBufferCreateInfo.pNext;
  outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  outputBufferCreateInfo._4_4_ = 0;
  outputBufferCreateInfo.pNext = (void *)0x0;
  outputBufferCreateInfo.flags = 0;
  outputBufferCreateInfo._20_4_ = 0;
  outputBufferCreateInfo.size = 0;
  if (pixelBuffer.m_format != (TextureFormat)0x0) {
    operator_delete((void *)pixelBuffer.m_format,pixelBuffer._16_8_ - (long)pixelBuffer.m_format);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&outputBufferCreateInfo,
                    (DeviceInterface *)vk.m_internal,
                    (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                    super_RefBase<vk::VkDevice_s_*>.m_data.object,
                    (VkDescriptorPool)subresource._0_8_,
                    (VkDescriptorSetLayout)
                    imageResidencyMemoryBinds.
                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  VVar7 = outputBufferCreateInfo.size;
  uVar13 = outputBufferCreateInfo._16_8_;
  offset.x = outputBufferCreateInfo.sType;
  offset.y = outputBufferCreateInfo._4_4_;
  stack0xfffffffffffffa30 = (long *)outputBufferCreateInfo.pNext;
  dVar15 = getNumLayers(this->m_imageType,imageSize);
  pVVar10 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
            super_RefBase<vk::VkDevice_s_*>.m_data.object;
  imageViewType = mapImageViewType(this->m_imageType);
  format_00 = ::vk::mapTextureFormat(format);
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = dVar15;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&outputBufferCreateInfo,
                (DeviceInterface *)vk.m_internal,pVVar10,(VkImage)image,imageViewType,format_00,
                subresourceRange);
  extent.width = outputBufferCreateInfo.sType;
  extent.height = outputBufferCreateInfo._4_4_;
  stack0xfffffffffffffad0 = outputBufferCreateInfo.pNext;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&outputBufferCreateInfo);
  this_03 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&outputBufferCreateInfo,offset.x,(void *)0x0,0)
  ;
  ::vk::DescriptorSetUpdateBuilder::update
            (this_03,(DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object);
  if (outputBufferCreateInfo.pQueueFamilyIndices != (deUint32 *)0x0) {
    operator_delete(outputBufferCreateInfo.pQueueFamilyIndices,
                    (long)local_7a8 - (long)outputBufferCreateInfo.pQueueFamilyIndices);
  }
  if (outputBufferCreateInfo.size != 0) {
    operator_delete((void *)outputBufferCreateInfo.size,
                    outputBufferCreateInfo._40_8_ - outputBufferCreateInfo.size);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&outputBufferCreateInfo);
  (*(*(_func_int ***)vk.m_internal)[0x56])
            (vk.m_internal,commandBuffer,1,imageResidencyBindInfo.image.m_internal,0,1,&offset,0,0);
  dVar38 = pQVar22->queueFamilyIndex;
  srcQueueFamilyIndex = pQVar21->queueFamilyIndex;
  if (pQVar21->queueFamilyIndex == pQVar22->queueFamilyIndex) {
    dVar38 = 0xffffffff;
    srcQueueFamilyIndex = 0xffffffff;
  }
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = dVar15;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_GENERAL,srcQueueFamilyIndex,dVar38,(VkImage)image,subresourceRange_00);
  (*(*(_func_int ***)vk.m_internal)[0x6d])
            (vk.m_internal,commandBuffer,1,0x800,0,0,0,0,0,1,
             (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
  getShaderGridSize((sparse *)&gridSize,this->m_imageType,imageSize,0);
  uVar31 = 0x80;
  if (gridSize.m_data[0] < 0x80) {
    uVar31 = (ulong)gridSize.m_data[0];
  }
  uVar19 = (uint)(0x80 / uVar31);
  if (gridSize.m_data[1] < uVar19) {
    uVar19 = gridSize.m_data[1];
  }
  if (0x7f < uVar19) {
    uVar19 = 0x80;
  }
  uVar27 = (uint)(0x80 / (ulong)(uVar19 * (int)uVar31));
  if (gridSize.m_data[2] < uVar27) {
    uVar27 = gridSize.m_data[2];
  }
  uVar39 = 0x40;
  if (uVar27 < 0x40) {
    uVar39 = (ulong)uVar27;
  }
  uVar27 = ((int)(gridSize.m_data[0] / uVar31) + 1) -
           (uint)((int)((ulong)gridSize.m_data[0] % uVar31) == 0);
  uVar18 = (gridSize.m_data[1] / uVar19 + 1) - (uint)(gridSize.m_data[1] % uVar19 == 0);
  uVar19 = ((int)(gridSize.m_data[2] / uVar39) + 1) -
           (uint)((int)((ulong)gridSize.m_data[2] % uVar39) == 0);
  if (0xffff < (uVar18 | uVar27 | uVar19)) {
    pNVar26 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar26,"Image size is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0x1d3);
    __cxa_throw(pNVar26,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (*(*(_func_int ***)vk.m_internal)[0x5d])
            (vk.m_internal,commandBuffer,(ulong)uVar27,(ulong)uVar18,(ulong)uVar19);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = dVar15;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)image,subresourceRange_01);
  (*(*(_func_int ***)vk.m_internal)[0x6d])
            (vk.m_internal,commandBuffer,0x800,0x1000,0,0,0,0,0,1,
             (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
  dVar15 = getNumPixels(this->m_imageType,imageSize);
  iVar45 = tcu::getPixelSize(*format);
  uVar31 = (ulong)(iVar45 * dVar15);
  makeBufferCreateInfo(&outputBufferCreateInfo,uVar31,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pixelBuffer,
                     (DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  DStack_460.m_device = (VkDevice)pixelBuffer._16_8_;
  DStack_460.m_allocator = (VkAllocationCallbacks *)pixelBuffer.m_pitch.m_data._4_8_;
  local_468 = pixelBuffer.m_format;
  DStack_460.m_deviceIface = (DeviceInterface *)pixelBuffer.m_size.m_data._0_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&pixelBuffer,
             (DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseResourcesBaseInstance).m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)pixelBuffer.m_format,(MemoryRequirement)0x1);
  TVar3 = pixelBuffer.m_format;
  VVar53.height = 0;
  VVar53.width = local_4a4.depth;
  VVar53.depth = local_494;
  makeBufferImageCopy((VkBufferImageCopy *)&pixelBuffer,(sparse *)local_4a4._0_8_,VVar53,0,0,
                      in_stack_fffffffffffff798);
  (*(*(_func_int ***)vk.m_internal)[99])
            (vk.m_internal,commandBuffer,image,6,local_468,1,(int)(VkBufferImageCopy *)&pixelBuffer)
  ;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&pixelBuffer,0x1000,0x2000,(VkBuffer)local_468,0,uVar31);
  (*(*(_func_int ***)vk.m_internal)[0x6d])
            (vk.m_internal,commandBuffer,0x1000,0x4000,0,0,0,1,(VkBufferMemoryBarrier *)&pixelBuffer
             ,0,0);
  endCommandBuffer((DeviceInterface *)vk.m_internal,(VkCommandBuffer)commandBuffer);
  stageBits[0] = 0x800;
  submitCommandsAndWait
            ((DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar22->queueHandle,
             (VkCommandBuffer)commandBuffer,1,&local_448,stageBits,0,(VkSemaphore *)0x0);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkDeviceMemory)*(deUint64 *)((long)TVar3 + 8),*(VkDeviceSize *)((long)TVar3 + 0x10),
             uVar31);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&pixelBuffer,format,gridSize.m_data[0],gridSize.m_data[1],gridSize.m_data[2],
             *(void **)((long)TVar3 + 0x18));
  (*(*(_func_int ***)vk.m_internal)[3])(vk.m_internal);
  if (uVar43 == 0) {
    VVar53 = mipLevelExtents(&local_4a4,0);
    bVar14 = local_494 * VVar53.depth != 0;
    if (bVar14) {
      local_800 = (string *)&local_808->m_description;
      psVar2 = &local_808->m_description;
      uVar51 = 0;
      local_7f0 = VVar53._0_8_ >> 0x20;
      local_7f8 = CONCAT44(local_7f8._4_4_,VVar53.depth);
      do {
        if (local_7f0 != 0) {
          uVar31 = 0;
          bVar52 = VVar53._0_8_ >> 0x20 != 0;
          do {
            local_850 = VVar53.width;
            iVar45 = (int)uVar31;
            if (local_850 != 0) {
              iVar30 = (int)(uVar31 * 0x2040811 >> 0x20);
              uVar31 = 0;
              do {
                iVar49 = (int)uVar31;
                iVar29 = (int)(uVar31 * 0x2040811 >> 0x20);
                referenceValue.m_data[1] =
                     (((uint)(iVar45 - iVar30) >> 1) + iVar30 >> 6) * -0x7f + iVar45;
                referenceValue.m_data[0] =
                     (((uint)(iVar49 - iVar29) >> 1) + iVar29 >> 6) * -0x7f + iVar49;
                referenceValue.m_data[3] = 1;
                referenceValue.m_data[2] = uVar51 % 0x7f;
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)&outputValue,(int)&pixelBuffer,iVar49,iVar45);
                iVar29 = tcu::getNumUsedChannels(format->order);
                iVar29 = bcmp((ConstPixelBufferAccess *)&outputValue,&referenceValue,
                              (long)iVar29 << 2);
                if (iVar29 != 0) {
                  local_828 = local_818;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"Failed","");
                  local_808->m_code = QP_TEST_RESULT_FAIL;
                  (local_808->m_description)._M_dataplus._M_p = (pointer)&psVar2->field_2;
                  std::__cxx11::string::_M_construct<char*>
                            (local_800,local_828,local_820 + (long)local_828);
                  if (local_828 != local_818) {
                    operator_delete(local_828,local_818[0] + 1);
                  }
                  if (!bVar52) goto LAB_007542be;
                  if (bVar14) goto LAB_0075433d;
                  goto LAB_007542dc;
                }
                uVar31 = (ulong)(iVar49 + 1U);
              } while (local_850 != iVar49 + 1U);
            }
            uVar36 = iVar45 + 1;
            uVar31 = (ulong)uVar36;
            local_708 = VVar53.height;
            bVar52 = uVar36 < local_708;
          } while (uVar36 != local_708);
        }
LAB_007542be:
        uVar51 = uVar51 + 1;
        bVar14 = uVar51 < local_494 * (int)local_7f8;
      } while (bVar14);
    }
LAB_007542dc:
    local_828 = local_818;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"Passed","");
    local_808->m_code = QP_TEST_RESULT_PASS;
    (local_808->m_description)._M_dataplus._M_p = (pointer)&(local_808->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_808->m_description,local_828,local_820 + (long)local_828);
    if (local_828 != local_818) {
      operator_delete(local_828,local_818[0] + 1);
    }
  }
  else {
    VVar53 = mipLevelExtents(&local_4a4,0);
    uVar31 = VVar53._0_8_ & 0xffffffff;
    uVar39 = VVar53._0_8_ >> 0x20;
    uVar19 = VVar53.depth % uVar5;
    local_670 = 0;
    local_53c = uVar19;
    if (uVar19 == 0) {
      local_53c = uVar5;
    }
    uVar27 = (uint)(uVar39 % (ulong)uVar36);
    uVar43 = uVar27;
    if (uVar27 == 0) {
      uVar43 = uVar36;
    }
    uVar42 = (uint)(uVar31 % (ulong)uVar51);
    uVar18 = uVar42;
    if (uVar42 == 0) {
      uVar18 = uVar51;
    }
    if (local_494 == 0) goto LAB_007542dc;
    uVar42 = (int)(uVar31 / uVar51) + (uint)(uVar42 != 0);
    uVar27 = (int)(uVar39 / uVar36) + (uint)(uVar27 != 0);
    uVar19 = VVar53.depth / uVar5 + (uint)(uVar19 != 0);
    local_540 = uVar19 - 1;
    psVar2 = &local_808->m_description;
    paVar32 = &(local_808->m_description).field_2;
    local_544 = uVar5 * uVar19;
    local_74c = 0;
    do {
      if (uVar19 != 0) {
        uVar37 = 0;
        local_66c = local_670;
        do {
          if (uVar27 != 0) {
            iVar45 = local_74c * uVar19 + uVar37;
            uVar33 = iVar45 * uVar5;
            uVar34 = uVar5;
            if (uVar37 == local_540) {
              uVar34 = local_53c;
            }
            local_83c = 0;
            uVar44 = 0;
            do {
              if (uVar42 != 0) {
                uVar17 = uVar44 * uVar36;
                uVar16 = uVar36;
                if (uVar44 == uVar27 - 1) {
                  uVar16 = uVar43;
                }
                local_550 = (ulong)((iVar45 * uVar27 + uVar44) * uVar42);
                iVar30 = 0;
                local_7f0 = 1;
                uVar35 = 0;
                do {
                  uVar40 = uVar35 * uVar51;
                  psVar41 = (string *)(ulong)uVar40;
                  uVar50 = uVar51;
                  if (uVar35 == uVar42 - 1) {
                    uVar50 = uVar18;
                  }
                  local_7f8 = (ulong)uVar50;
                  local_800 = psVar41;
                  if (((int)local_550 + uVar35 & 1) == 0) {
                    if (uVar33 < uVar33 + uVar34) {
                      uVar50 = uVar50 + uVar40;
                      uVar28 = uVar33;
                      do {
                        if (uVar17 < uVar16 + uVar17) {
                          uVar31 = (ulong)uVar17;
                          do {
                            iVar29 = 0x23;
                            iVar49 = (int)uVar31;
                            bVar14 = uVar40 < uVar50;
                            if ((uint)psVar41 < uVar50) {
                              iVar29 = (int)(uVar31 * 0x2040811 >> 0x20);
                              iVar46 = 0;
                              uVar31 = (ulong)psVar41 & 0xffffffff;
                              do {
                                iVar20 = (int)(uVar31 * 0x2040811 >> 0x20);
                                referenceValue.m_data[1] =
                                     (((uint)(iVar49 - iVar29) >> 1) + iVar29 >> 6) * -0x7f + iVar49
                                ;
                                referenceValue.m_data[0] =
                                     (((uint)((int)uVar31 - iVar20) >> 1) + iVar20 >> 6) * -0x7f +
                                     iVar30 + iVar46;
                                referenceValue.m_data[3] = 1;
                                referenceValue.m_data[2] = uVar28 % 0x7f;
                                tcu::ConstPixelBufferAccess::getPixelInt
                                          ((ConstPixelBufferAccess *)&outputValue,(int)&pixelBuffer,
                                           iVar30 + iVar46,iVar49);
                                iVar20 = tcu::getNumUsedChannels(format->order);
                                iVar20 = bcmp(&outputValue,&referenceValue,(long)iVar20 << 2);
                                if (iVar20 != 0) {
                                  local_828 = local_818;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_828,"Failed","");
                                  local_808->m_code = QP_TEST_RESULT_FAIL;
                                  (local_808->m_description)._M_dataplus._M_p = (pointer)paVar32;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)psVar2,local_828,local_820 + (long)local_828)
                                  ;
                                  if (local_828 != local_818) {
                                    operator_delete(local_828,local_818[0] + 1);
                                  }
                                  iVar29 = 1;
                                  psVar41 = local_800;
                                  goto LAB_00753d65;
                                }
                                uVar31 = (ulong)((int)uVar31 + 1);
                                bVar14 = (uint)((int)local_7f0 + iVar46) < uVar50;
                                iVar46 = iVar46 + 1;
                              } while ((int)local_7f8 != iVar46);
                              iVar29 = 0x23;
                              psVar41 = local_800;
                            }
LAB_00753d65:
                            if (bVar14) goto LAB_00753d81;
                            uVar31 = (ulong)(iVar49 + 1U);
                          } while (iVar49 + 1U != uVar16 + local_83c);
                        }
                        iVar29 = 0x20;
LAB_00753d81:
                        if (iVar29 != 0x20) goto LAB_00753dd7;
                        uVar28 = uVar28 + 1;
                      } while (uVar28 != uVar34 + local_66c);
                    }
                    iVar29 = 0x1d;
LAB_00753dd7:
                    if (iVar29 == 0x1d) goto LAB_00753fdb;
                  }
                  else {
                    if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict != 0) {
                      if (uVar33 < uVar33 + uVar34) {
                        uVar50 = uVar50 + uVar40;
                        uVar28 = uVar33;
                        do {
                          uVar31 = (ulong)uVar17;
                          if (uVar17 < uVar16 + uVar17) {
                            do {
                              iVar29 = 0x2c;
                              bVar14 = uVar40 < uVar50;
                              if ((uint)psVar41 < uVar50) {
                                uVar48 = local_7f8 & 0xffffffff;
                                uVar39 = local_7f0;
                                do {
                                  uVar47 = (uint)uVar39;
                                  referenceValue.m_data[0] = 0;
                                  referenceValue.m_data[1] = 0;
                                  referenceValue.m_data[2] = 0;
                                  referenceValue.m_data[3] = 0;
                                  tcu::ConstPixelBufferAccess::getPixelInt
                                            ((ConstPixelBufferAccess *)&outputValue,
                                             (int)&pixelBuffer,uVar47 - 1,(int)uVar31);
                                  iVar29 = tcu::getNumUsedChannels(format->order);
                                  iVar29 = bcmp(&outputValue,&referenceValue,(long)iVar29 << 2);
                                  if (iVar29 != 0) {
                                    local_828 = local_818;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_828,"Failed","");
                                    local_808->m_code = QP_TEST_RESULT_FAIL;
                                    (local_808->m_description)._M_dataplus._M_p = (pointer)paVar32;
                                    std::__cxx11::string::_M_construct<char*>
                                              ((string *)psVar2,local_828,
                                               local_820 + (long)local_828);
                                    if (local_828 != local_818) {
                                      operator_delete(local_828,local_818[0] + 1);
                                    }
                                    iVar29 = 1;
                                    psVar41 = local_800;
                                    goto LAB_00753f94;
                                  }
                                  bVar14 = uVar47 < uVar50;
                                  uVar39 = (ulong)(uVar47 + 1);
                                  uVar47 = (int)uVar48 - 1;
                                  uVar48 = (ulong)uVar47;
                                } while (uVar47 != 0);
                                iVar29 = 0x2c;
                                psVar41 = local_800;
                              }
LAB_00753f94:
                              if (bVar14) goto LAB_00753fb8;
                              uVar47 = (int)uVar31 + 1;
                              uVar31 = (ulong)uVar47;
                            } while (uVar47 != uVar16 + local_83c);
                          }
                          iVar29 = 0x29;
LAB_00753fb8:
                          if (iVar29 != 0x29) goto LAB_00753fd6;
                          uVar28 = uVar28 + 1;
                        } while (uVar28 != uVar34 + local_66c);
                      }
                      iVar29 = 0x26;
LAB_00753fd6:
                      if (iVar29 != 0x26) goto LAB_00753fdd;
                    }
LAB_00753fdb:
                    iVar29 = 0;
                  }
LAB_00753fdd:
                  if (iVar29 != 0) goto LAB_00754011;
                  uVar35 = uVar35 + 1;
                  iVar30 = iVar30 + uVar51;
                  local_7f0 = (ulong)((int)local_7f0 + uVar51);
                } while (uVar35 < uVar42);
              }
              iVar29 = 0x1a;
LAB_00754011:
              if (iVar29 != 0x1a) goto LAB_00754042;
              uVar44 = uVar44 + 1;
              local_83c = local_83c + uVar36;
            } while (uVar44 < uVar27);
          }
          iVar29 = 0x17;
LAB_00754042:
          if (iVar29 != 0x17) goto LAB_0075406e;
          uVar37 = uVar37 + 1;
          local_66c = local_66c + uVar5;
        } while (uVar37 < uVar19);
      }
      iVar29 = 0x14;
LAB_0075406e:
      if (iVar29 != 0x14) goto LAB_007540a3;
      local_74c = local_74c + 1;
      local_670 = local_670 + local_544;
    } while (local_74c < local_494);
    iVar29 = 0x11;
LAB_007540a3:
    if (iVar29 == 0x11) goto LAB_007542dc;
  }
LAB_0075433d:
  if (TVar3 != (TextureFormat)0x0) {
    (**(code **)(*(long *)TVar3 + 8))();
  }
  if (local_468 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_460,(VkBuffer)local_468);
  }
  if (extent._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&extent.depth,(VkImageView)extent._0_8_);
  }
  if (offset._0_8_ != 0) {
    outputBufferCreateInfo.sType = offset.x;
    outputBufferCreateInfo._4_4_ = offset.y;
    (**(code **)(*stack0xfffffffffffffa30 + 0x1e8))(stack0xfffffffffffffa30,uVar13,VVar7,1);
  }
  if (subresource._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&subresource.arrayLayer,
               (VkDescriptorPool)subresource._0_8_);
  }
  if (imageMipTailBindInfo.image.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&imageMipTailBindInfo.bindCount,
               (VkPipeline)imageMipTailBindInfo.image.m_internal);
  }
  if (imageResidencyBindInfo.image.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&imageResidencyBindInfo.bindCount,
               (VkPipelineLayout)imageResidencyBindInfo.image.m_internal);
  }
  if (imageMipTailMemoryBinds.
      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
               &imageMipTailMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_finish,
               (VkShaderModule)
               imageMipTailMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  if (imageResidencyMemoryBinds.
      super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)
               &imageResidencyMemoryBinds.
                super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (VkDescriptorSetLayout)
               imageResidencyMemoryBinds.
               super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (commandBuffer != 0) {
    outputBufferCreateInfo._0_8_ = commandBuffer;
    (**(code **)(*pvVar11 + 0x240))(pvVar11,uVar12,VVar6,1);
  }
  if (sparseMemoryRequirements.
      super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
               &sparseMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (VkCommandPool)
               sparseMemoryRequirements.
               super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00754496:
  if (local_448.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()(&DStack_440,local_448);
  }
  if (image != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_570,(VkImage)image);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector(&deviceMemUniquePtrVec);
  return local_808;
}

Assistant:

tcu::TestStatus ImageSparseResidencyInstance::iterate (void)
{
	const InstanceInterface&			instance = m_context.getInstanceInterface();
	const VkPhysicalDevice				physicalDevice = m_context.getPhysicalDevice();
	const VkPhysicalDeviceProperties	physicalDeviceProperties = getPhysicalDeviceProperties(instance, physicalDevice);
	VkImageCreateInfo					imageCreateInfo;
	VkSparseImageMemoryRequirements		aspectRequirements;
	VkExtent3D							imageGranularity;
	std::vector<DeviceMemorySp>			deviceMemUniquePtrVec;

	// Check if image size does not exceed device limits
	if (!isImageSizeSupported(instance, physicalDevice, m_imageType, m_imageSize))
		TCU_THROW(NotSupportedError, "Image size not supported for device");

	// Check if device supports sparse operations for image type
	if (!checkSparseSupportForImageType(instance, physicalDevice, m_imageType))
		TCU_THROW(NotSupportedError, "Sparse residency for image type is not supported");

	imageCreateInfo.sType					= VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	imageCreateInfo.pNext					= DE_NULL;
	imageCreateInfo.flags					= VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT | VK_IMAGE_CREATE_SPARSE_BINDING_BIT;
	imageCreateInfo.imageType				= mapImageType(m_imageType);
	imageCreateInfo.format					= mapTextureFormat(m_format);
	imageCreateInfo.extent					= makeExtent3D(getLayerSize(m_imageType, m_imageSize));
	imageCreateInfo.mipLevels				= 1u;
	imageCreateInfo.arrayLayers				= getNumLayers(m_imageType, m_imageSize);
	imageCreateInfo.samples					= VK_SAMPLE_COUNT_1_BIT;
	imageCreateInfo.tiling					= VK_IMAGE_TILING_OPTIMAL;
	imageCreateInfo.initialLayout			= VK_IMAGE_LAYOUT_UNDEFINED;
	imageCreateInfo.usage					= VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
											  VK_IMAGE_USAGE_STORAGE_BIT;
	imageCreateInfo.sharingMode				= VK_SHARING_MODE_EXCLUSIVE;
	imageCreateInfo.queueFamilyIndexCount	= 0u;
	imageCreateInfo.pQueueFamilyIndices		= DE_NULL;

	if (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY)
	{
		imageCreateInfo.flags |= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
	}

	// Check if device supports sparse operations for image format
	if (!checkSparseSupportForImageFormat(instance, physicalDevice, imageCreateInfo))
		TCU_THROW(NotSupportedError, "The image format does not support sparse operations");

	{
		// Create logical device supporting both sparse and compute queues
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	// Create sparse image
	const Unique<VkImage> sparseImage(createImage(deviceInterface, getDevice(), &imageCreateInfo));

	// Create sparse image memory bind semaphore
	const Unique<VkSemaphore> imageMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	{
		// Get image general memory requirements
		const VkMemoryRequirements imageMemoryRequirements = getImageMemoryRequirements(deviceInterface, getDevice(), *sparseImage);

		if (imageMemoryRequirements.size > physicalDeviceProperties.limits.sparseAddressSpaceSize)
			TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits");

		DE_ASSERT((imageMemoryRequirements.size % imageMemoryRequirements.alignment) == 0);

		// Get sparse image sparse memory requirements
		const std::vector<VkSparseImageMemoryRequirements> sparseMemoryRequirements = getImageSparseMemoryRequirements(deviceInterface, getDevice(), *sparseImage);

		DE_ASSERT(sparseMemoryRequirements.size() != 0);

		const deUint32 colorAspectIndex = getSparseAspectRequirementsIndex(sparseMemoryRequirements, VK_IMAGE_ASPECT_COLOR_BIT);

		if (colorAspectIndex == NO_MATCH_FOUND)
			TCU_THROW(NotSupportedError, "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT");

		aspectRequirements	= sparseMemoryRequirements[colorAspectIndex];
		imageGranularity	= aspectRequirements.formatProperties.imageGranularity;

		const VkImageAspectFlags aspectMask = aspectRequirements.formatProperties.aspectMask;

		DE_ASSERT((aspectRequirements.imageMipTailSize % imageMemoryRequirements.alignment) == 0);

		std::vector<VkSparseImageMemoryBind> imageResidencyMemoryBinds;
		std::vector<VkSparseMemoryBind>		 imageMipTailMemoryBinds;

		const deUint32						 memoryType = findMatchingMemoryType(instance, physicalDevice, imageMemoryRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		// Bind device memory for each aspect
		for (deUint32 layerNdx = 0; layerNdx < imageCreateInfo.arrayLayers; ++layerNdx)
		{
			for (deUint32 mipLevelNdx = 0; mipLevelNdx < aspectRequirements.imageMipTailFirstLod; ++mipLevelNdx)
			{
				const VkImageSubresource subresource		= { aspectMask, mipLevelNdx, layerNdx };
				const VkExtent3D		 mipExtent			= mipLevelExtents(imageCreateInfo.extent, mipLevelNdx);
				const tcu::UVec3		 numSparseBinds		= alignedDivide(mipExtent, imageGranularity);
				const tcu::UVec3		 lastBlockExtent	= tcu::UVec3(mipExtent.width  % imageGranularity.width  ? mipExtent.width   % imageGranularity.width  : imageGranularity.width,
																		 mipExtent.height % imageGranularity.height ? mipExtent.height  % imageGranularity.height : imageGranularity.height,
																		 mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth   % imageGranularity.depth  : imageGranularity.depth);
				for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
				for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
				for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
				{
					const deUint32 linearIndex = x + y*numSparseBinds.x() + z*numSparseBinds.x()*numSparseBinds.y() + layerNdx*numSparseBinds.x()*numSparseBinds.y()*numSparseBinds.z();

					if (linearIndex % 2u == 1u)
					{
						continue;
					}

					VkOffset3D offset;
					offset.x = x*imageGranularity.width;
					offset.y = y*imageGranularity.height;
					offset.z = z*imageGranularity.depth;

					VkExtent3D extent;
					extent.width  = (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
					extent.height = (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
					extent.depth  = (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

					const VkSparseImageMemoryBind imageMemoryBind = makeSparseImageMemoryBind(deviceInterface, getDevice(),
						imageMemoryRequirements.alignment, memoryType, subresource, offset, extent);

					deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

					imageResidencyMemoryBinds.push_back(imageMemoryBind);
				}
			}

			if (!(aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) && aspectRequirements.imageMipTailFirstLod < imageCreateInfo.mipLevels)
			{
				const VkSparseMemoryBind imageMipTailMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
					aspectRequirements.imageMipTailSize, memoryType, aspectRequirements.imageMipTailOffset + layerNdx * aspectRequirements.imageMipTailStride);

				deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMipTailMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

				imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
			}
		}

		if ((aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) && aspectRequirements.imageMipTailFirstLod < imageCreateInfo.mipLevels)
		{
			const VkSparseMemoryBind imageMipTailMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
				aspectRequirements.imageMipTailSize, memoryType, aspectRequirements.imageMipTailOffset);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMipTailMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
		}

		VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		VkSparseImageMemoryBindInfo		  imageResidencyBindInfo;
		VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;

		if (imageResidencyMemoryBinds.size() > 0)
		{
			imageResidencyBindInfo.image		= *sparseImage;
			imageResidencyBindInfo.bindCount	= static_cast<deUint32>(imageResidencyMemoryBinds.size());
			imageResidencyBindInfo.pBinds		= &imageResidencyMemoryBinds[0];

			bindSparseInfo.imageBindCount		= 1u;
			bindSparseInfo.pImageBinds			= &imageResidencyBindInfo;
		}

		if (imageMipTailMemoryBinds.size() > 0)
		{
			imageMipTailBindInfo.image			= *sparseImage;
			imageMipTailBindInfo.bindCount		= static_cast<deUint32>(imageMipTailMemoryBinds.size());
			imageMipTailBindInfo.pBinds			= &imageMipTailMemoryBinds[0];

			bindSparseInfo.imageOpaqueBindCount = 1u;
			bindSparseInfo.pImageOpaqueBinds	= &imageMipTailBindInfo;
		}

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for compute and transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	// Create descriptor set layout
	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, getDevice()));

	// Create and bind compute pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("comp"), DE_NULL));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));
	const Unique<VkPipeline>		computePipeline(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule));

	deviceInterface.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	// Create and bind descriptor set
	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 1u)
		.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet>	descriptorSet(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));

	const VkImageSubresourceRange	subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));
	const Unique<VkImageView>		imageView(makeImageView(deviceInterface, getDevice(), *sparseImage, mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange));
	const VkDescriptorImageInfo		sparseImageInfo  = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &sparseImageInfo)
		.update(deviceInterface, getDevice());

	deviceInterface.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	{
		const VkImageMemoryBarrier sparseImageLayoutChangeBarrier = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? sparseQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? computeQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			*sparseImage,
			subresourceRange
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &sparseImageLayoutChangeBarrier);
	}

	const tcu::UVec3  gridSize = getShaderGridSize(m_imageType, m_imageSize);

	{
		const tcu::UVec3  workGroupSize = computeWorkGroupSize(gridSize);

		const deUint32 xWorkGroupCount = gridSize.x() / workGroupSize.x() + (gridSize.x() % workGroupSize.x() ? 1u : 0u);
		const deUint32 yWorkGroupCount = gridSize.y() / workGroupSize.y() + (gridSize.y() % workGroupSize.y() ? 1u : 0u);
		const deUint32 zWorkGroupCount = gridSize.z() / workGroupSize.z() + (gridSize.z() % workGroupSize.z() ? 1u : 0u);

		const tcu::UVec3 maxComputeWorkGroupCount = tcu::UVec3(65535u, 65535u, 65535u);

		if (maxComputeWorkGroupCount.x() < xWorkGroupCount ||
			maxComputeWorkGroupCount.y() < yWorkGroupCount ||
			maxComputeWorkGroupCount.z() < zWorkGroupCount)
		{
			TCU_THROW(NotSupportedError, "Image size is not supported");
		}

		deviceInterface.cmdDispatch(*commandBuffer, xWorkGroupCount, yWorkGroupCount, zWorkGroupCount);
	}

	{
		const VkImageMemoryBarrier sparseImageTrasferBarrier = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*sparseImage,
			subresourceRange
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &sparseImageTrasferBarrier);
	}

	const deUint32					imageSizeInBytes		= getNumPixels(m_imageType, m_imageSize) * tcu::getPixelSize(m_format);
	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	{
		const VkBufferImageCopy bufferImageCopy = makeBufferImageCopy(imageCreateInfo.extent, imageCreateInfo.arrayLayers);

		deviceInterface.cmdCopyImageToBuffer(*commandBuffer, *sparseImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &bufferImageCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferHostReadBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_HOST_READ_BIT,
			*outputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferHostReadBarrier, 0u, DE_NULL);
	}

	// End recording commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	// The stage at which execution is going to wait for finish of sparse binding operations
	const VkPipelineStageFlags stageBits[] = { VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT };

	// Submit commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &imageMemoryBindSemaphore.get(), stageBits);

	// Retrieve data from buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), imageSizeInBytes);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());
	const tcu::ConstPixelBufferAccess pixelBuffer = tcu::ConstPixelBufferAccess(m_format, gridSize.x(), gridSize.y(), gridSize.z(), outputData);

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Validate results
	if( aspectRequirements.imageMipTailFirstLod > 0u )
	{
		const VkExtent3D		 mipExtent		 = mipLevelExtents(imageCreateInfo.extent, 0u);
		const tcu::UVec3		 numSparseBinds  = alignedDivide(mipExtent, imageGranularity);
		const tcu::UVec3		 lastBlockExtent = tcu::UVec3(	mipExtent.width  % imageGranularity.width  ? mipExtent.width  % imageGranularity.width  : imageGranularity.width,
																mipExtent.height % imageGranularity.height ? mipExtent.height % imageGranularity.height : imageGranularity.height,
																mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth  % imageGranularity.depth  : imageGranularity.depth);

		for (deUint32 layerNdx = 0; layerNdx < imageCreateInfo.arrayLayers; ++layerNdx)
		{
			for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
			for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
			for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
			{
				VkExtent3D offset;
				offset.width  = x*imageGranularity.width;
				offset.height = y*imageGranularity.height;
				offset.depth  = z*imageGranularity.depth + layerNdx*numSparseBinds.z()*imageGranularity.depth;

				VkExtent3D extent;
				extent.width  = (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
				extent.height = (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
				extent.depth  = (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

				const deUint32 linearIndex = x + y*numSparseBinds.x() + z*numSparseBinds.x()*numSparseBinds.y() + layerNdx*numSparseBinds.x()*numSparseBinds.y()*numSparseBinds.z();

				if (linearIndex % 2u == 0u)
				{
					for (deUint32 offsetZ = offset.depth;  offsetZ < offset.depth  + extent.depth;  ++offsetZ)
					for (deUint32 offsetY = offset.height; offsetY < offset.height + extent.height; ++offsetY)
					for (deUint32 offsetX = offset.width;  offsetX < offset.width  + extent.width;  ++offsetX)
					{
						const tcu::UVec4 referenceValue = tcu::UVec4(offsetX % 127u, offsetY % 127u, offsetZ % 127u, 1u);
						const tcu::UVec4 outputValue	= pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

						if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
							return tcu::TestStatus::fail("Failed");
					}
				}
				else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict)
				{
					for (deUint32 offsetZ = offset.depth;  offsetZ < offset.depth  + extent.depth;  ++offsetZ)
					for (deUint32 offsetY = offset.height; offsetY < offset.height + extent.height; ++offsetY)
					for (deUint32 offsetX = offset.width;  offsetX < offset.width  + extent.width;  ++offsetX)
					{
						const tcu::UVec4 referenceValue = tcu::UVec4(0u, 0u, 0u, 0u);
						const tcu::UVec4 outputValue = pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

						if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
							return tcu::TestStatus::fail("Failed");
					}
				}
			}
		}
	}
	else
	{
		const VkExtent3D mipExtent = mipLevelExtents(imageCreateInfo.extent, 0u);

		for (deUint32 offsetZ = 0u; offsetZ < mipExtent.depth * imageCreateInfo.arrayLayers; ++offsetZ)
		for (deUint32 offsetY = 0u; offsetY < mipExtent.height; ++offsetY)
		for (deUint32 offsetX = 0u; offsetX < mipExtent.width;  ++offsetX)
		{
			const tcu::UVec4 referenceValue = tcu::UVec4(offsetX % 127u, offsetY % 127u, offsetZ % 127u, 1u);
			const tcu::UVec4 outputValue	= pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

			if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
				return tcu::TestStatus::fail("Failed");
		}
	}

	return tcu::TestStatus::pass("Passed");
}